

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppRemove(Vec_Wrd_t *p,int *pCounts,Vec_Wec_t *pS,Vec_Wec_t *pD,int iVar,int nVars)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  word wVar3;
  int local_40;
  int local_3c;
  int v;
  int i;
  word Entry;
  int nVars_local;
  int iVar_local;
  Vec_Wec_t *pD_local;
  Vec_Wec_t *pS_local;
  int *pCounts_local;
  Vec_Wrd_t *p_local;
  
  iVar1 = Vec_WecLevelSize(pS,iVar);
  if (iVar1 == 0) {
    pVVar2 = Vec_WecEntry(pD,iVar);
    Vec_IntClear(pVVar2);
    for (local_3c = 0; iVar1 = Vec_WrdSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      wVar3 = Vec_WrdEntry(p,local_3c);
      if ((wVar3 >> ((byte)iVar & 0x3f) & 1) != 0) {
        pCounts[local_3c] = pCounts[local_3c] + -1;
        if (pCounts[local_3c] == 1) {
          for (local_40 = 0; local_40 < nVars; local_40 = local_40 + 1) {
            if ((wVar3 >> ((byte)local_40 & 0x3f) & 1) != 0) {
              pVVar2 = Vec_WecEntry(pD,local_40);
              Vec_IntRemove(pVVar2,local_3c);
              Vec_WecPush(pS,local_40,local_3c);
            }
          }
        }
        else if (pCounts[local_3c] == 2) {
          for (local_40 = 0; local_40 < nVars; local_40 = local_40 + 1) {
            if ((wVar3 >> ((byte)local_40 & 0x3f) & 1) != 0) {
              Vec_WecPush(pD,local_40,local_3c);
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("Vec_WecLevelSize(pS, iVar) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilSupp.c"
                ,0x1a2,"void Abc_SuppRemove(Vec_Wrd_t *, int *, Vec_Wec_t *, Vec_Wec_t *, int, int)"
               );
}

Assistant:

void Abc_SuppRemove( Vec_Wrd_t * p, int * pCounts, Vec_Wec_t * pS, Vec_Wec_t * pD, int iVar, int nVars )
{
    word Entry; int i, v;
    assert( Vec_WecLevelSize(pS, iVar) == 0 );
    Vec_IntClear( Vec_WecEntry(pD, iVar) );
    Vec_WrdForEachEntry( p, Entry, i )
    {
        if ( ((Entry >> iVar) & 1) == 0 )
            continue;
        pCounts[i]--;
        if ( pCounts[i] == 1 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                {
                    Vec_IntRemove( Vec_WecEntry(pD, v), i );
                    Vec_WecPush( pS, v, i );
                }
        }
        else if ( pCounts[i] == 2 )
        {
            for ( v = 0; v < nVars; v++ )
                if ( (Entry >> v) & 1 )
                    Vec_WecPush( pD, v, i );
        }        
    }
}